

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitter::~QSplitter(QSplitter *this)

{
  ~QSplitter(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

QSplitter::~QSplitter()
{
    Q_D(QSplitter);
#if QT_CONFIG(rubberband)
    delete d->rubberBand;
#endif
    while (!d->list.isEmpty())
        delete d->list.takeFirst();
}